

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void cfd::api::json::DecodeRawTransactionTxIn::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>_>_>,_bool>
  pVar2;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn> func_table;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn> *in_stack_fffffffffffffb08;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn> *in_stack_fffffffffffffb10;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn> *this;
  char (*in_stack_fffffffffffffb18) [12];
  char (*__args) [9];
  function<void_(cfd::api::json::DecodeRawTransactionTxIn_&,_const_UniValue_&)>
  *in_stack_fffffffffffffb20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>_>_>_>
  *this_00;
  undefined1 local_3f9 [49];
  char local_3c8 [103];
  allocator local_361;
  string local_360 [32];
  _Base_ptr local_340;
  undefined1 local_338;
  allocator local_2c9;
  string local_2c8 [32];
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  allocator local_231;
  string local_230 [32];
  _Base_ptr local_210;
  undefined1 local_208;
  allocator local_199;
  string local_198 [32];
  _Base_ptr local_178;
  undefined1 local_170;
  allocator local_101;
  string local_100 [32];
  _Base_ptr local_e0;
  undefined1 local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>_>_>_>
  local_60 [2];
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>_>_>_>
                   *)0x4a0c93);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>::CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffb10);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffffb20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionTxIn_ptr
                *)in_stack_fffffffffffffb18);
    std::function<void(cfd::api::json::DecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffffb20,
               (_func_void_DecodeRawTransactionTxIn_ptr_UniValue_ptr *)in_stack_fffffffffffffb18);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffb20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb18);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffb10);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[9],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>_>_>_>
                        *)in_stack_fffffffffffffb20,(char (*) [9])in_stack_fffffffffffffb18,
                       in_stack_fffffffffffffb10);
    local_e0 = (_Base_ptr)pVar2.first._M_node;
    local_d8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"coinbase",&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb10,(value_type *)in_stack_fffffffffffffb08);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffffb20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionTxIn_ptr
                *)in_stack_fffffffffffffb18);
    std::function<void(cfd::api::json::DecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffffb20,
               (_func_void_DecodeRawTransactionTxIn_ptr_UniValue_ptr *)in_stack_fffffffffffffb18);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffb20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb18);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffb10);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>_>_>_>
                        *)in_stack_fffffffffffffb20,(char (*) [5])in_stack_fffffffffffffb18,
                       in_stack_fffffffffffffb10);
    local_178 = (_Base_ptr)pVar2.first._M_node;
    local_170 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"txid",&local_199);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb10,(value_type *)in_stack_fffffffffffffb08);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffffb20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionTxIn_ptr
                *)in_stack_fffffffffffffb18);
    std::function<void(cfd::api::json::DecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffffb20,
               (_func_void_DecodeRawTransactionTxIn_ptr_UniValue_ptr *)in_stack_fffffffffffffb18);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffb20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb18);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffb10);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>_>_>_>
                        *)in_stack_fffffffffffffb20,(char (*) [5])in_stack_fffffffffffffb18,
                       in_stack_fffffffffffffb10);
    local_210 = (_Base_ptr)pVar2.first._M_node;
    local_208 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,"vout",&local_231);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb10,(value_type *)in_stack_fffffffffffffb08);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffffb20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionTxIn_ptr
                *)in_stack_fffffffffffffb18);
    std::function<void(cfd::api::json::DecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffffb20,
               (_func_void_DecodeRawTransactionTxIn_ptr_UniValue_ptr *)in_stack_fffffffffffffb18);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffb20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb18);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffb10);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[10],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>_>_>_>
                        *)in_stack_fffffffffffffb20,(char (*) [10])in_stack_fffffffffffffb18,
                       in_stack_fffffffffffffb10);
    local_2a8 = (_Base_ptr)pVar2.first._M_node;
    local_2a0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,"scriptSig",&local_2c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb10,(value_type *)in_stack_fffffffffffffb08);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffffb20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionTxIn_ptr
                *)in_stack_fffffffffffffb18);
    std::function<void(cfd::api::json::DecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffffb20,
               (_func_void_DecodeRawTransactionTxIn_ptr_UniValue_ptr *)in_stack_fffffffffffffb18);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffb20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb18);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffb10);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[12],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>_>_>_>
                        *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                       in_stack_fffffffffffffb10);
    local_340 = (_Base_ptr)pVar2.first._M_node;
    local_338 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"txinwitness",&local_361);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb10,(value_type *)in_stack_fffffffffffffb08);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    __args = (char (*) [9])local_3c8;
    std::function<std::__cxx11::string(cfd::api::json::DecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffffb20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeRawTransactionTxIn_ptr
                *)__args);
    std::function<void(cfd::api::json::DecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffffb20,
               (_func_void_DecodeRawTransactionTxIn_ptr_UniValue_ptr *)__args);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffb20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
    this_00 = local_60;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffb10);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[9],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>&>
                      (this_00,__args,in_stack_fffffffffffffb10);
    local_3f9._33_8_ = pVar2.first._M_node;
    local_3f9[0x29] = pVar2.second;
    this = (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn> *)local_3f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_3f9 + 1),"sequence",(allocator *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,(value_type *)in_stack_fffffffffffffb08);
    std::__cxx11::string::~string((string *)(local_3f9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3f9);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionTxIn>::~CLASS_FUNCTION_TABLE
              (this);
  }
  return;
}

Assistant:

void DecodeRawTransactionTxIn::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<DecodeRawTransactionTxIn> func_table;  // NOLINT

  func_table = {
    DecodeRawTransactionTxIn::GetCoinbaseString,
    DecodeRawTransactionTxIn::SetCoinbaseString,
    DecodeRawTransactionTxIn::GetCoinbaseFieldType,
  };
  json_mapper.emplace("coinbase", func_table);
  item_list.push_back("coinbase");
  func_table = {
    DecodeRawTransactionTxIn::GetTxidString,
    DecodeRawTransactionTxIn::SetTxidString,
    DecodeRawTransactionTxIn::GetTxidFieldType,
  };
  json_mapper.emplace("txid", func_table);
  item_list.push_back("txid");
  func_table = {
    DecodeRawTransactionTxIn::GetVoutString,
    DecodeRawTransactionTxIn::SetVoutString,
    DecodeRawTransactionTxIn::GetVoutFieldType,
  };
  json_mapper.emplace("vout", func_table);
  item_list.push_back("vout");
  func_table = {
    DecodeRawTransactionTxIn::GetScriptSigString,
    DecodeRawTransactionTxIn::SetScriptSigString,
    DecodeRawTransactionTxIn::GetScriptSigFieldType,
  };
  json_mapper.emplace("scriptSig", func_table);
  item_list.push_back("scriptSig");
  func_table = {
    DecodeRawTransactionTxIn::GetTxinwitnessString,
    DecodeRawTransactionTxIn::SetTxinwitnessString,
    DecodeRawTransactionTxIn::GetTxinwitnessFieldType,
  };
  json_mapper.emplace("txinwitness", func_table);
  item_list.push_back("txinwitness");
  func_table = {
    DecodeRawTransactionTxIn::GetSequenceString,
    DecodeRawTransactionTxIn::SetSequenceString,
    DecodeRawTransactionTxIn::GetSequenceFieldType,
  };
  json_mapper.emplace("sequence", func_table);
  item_list.push_back("sequence");
}